

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_constants_block(ModuleParseContext *this,BlockOrRecord *entry)

{
  BlockOrRecord *pBVar1;
  BlockOrRecord *pBVar2;
  bool bVar3;
  BlockOrRecord *entry_00;
  BlockOrRecord *child;
  
  this->constant_type = (Type *)0x0;
  pBVar1 = (entry->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (entry->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    entry_00 = pBVar2;
    if (entry_00 == pBVar1) break;
    bVar3 = parse_constants_record(this,entry_00);
    pBVar2 = entry_00 + 1;
  } while (bVar3);
  return entry_00 == pBVar1;
}

Assistant:

bool ModuleParseContext::parse_constants_block(const BlockOrRecord &entry)
{
	constant_type = nullptr;
	for (auto &child : entry.children)
		if (!parse_constants_record(child))
			return false;
	return true;
}